

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int ncnn::convolution(Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
                     int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,
                     int activation_type,Mat *activation_params,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int extraout_EAX;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  void *pvVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m;
  undefined1 local_148 [16];
  void *local_118;
  _Vector_base<int,_std::allocator<int>_> local_90;
  Mat local_78;
  
  iVar7 = bottom_blob->w;
  if (bias_data->data == (void *)0x0) {
    bVar23 = true;
  }
  else {
    bVar23 = (long)bias_data->c * bias_data->cstep == 0;
  }
  iVar1 = bottom_blob->c;
  uVar2 = top_blob->w;
  uVar3 = top_blob->h;
  uVar4 = top_blob->c;
  uVar5 = kernel_h * kernel_w;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_90,(long)(int)uVar5,
             (allocator_type *)&local_78);
  iVar6 = 0;
  iVar8 = 0;
  if (0 < kernel_w) {
    iVar8 = kernel_w;
  }
  iVar13 = 0;
  if (0 < kernel_h) {
    iVar13 = kernel_h;
  }
  iVar18 = 0;
  iVar16 = iVar8;
  for (iVar17 = 0; iVar17 != iVar13; iVar17 = iVar17 + 1) {
    for (lVar19 = (long)iVar18; iVar16 != lVar19; lVar19 = lVar19 + 1) {
      local_90._M_impl.super__Vector_impl_data._M_start[lVar19] = iVar6;
      iVar6 = iVar6 + dilation_w;
    }
    iVar6 = iVar6 + (iVar7 * dilation_h - dilation_w * kernel_w);
    iVar16 = iVar16 + iVar8;
    iVar18 = iVar8 + iVar18;
  }
  uVar22 = 0;
  if (0 < (int)uVar5) {
    uVar22 = (ulong)uVar5;
  }
  iVar7 = 0;
  if (0 < iVar1) {
    iVar7 = iVar1;
  }
  uVar14 = 0;
  if (0 < (int)uVar2) {
    uVar14 = (ulong)uVar2;
  }
  uVar9 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar9 = 0;
  }
  iVar8 = 0;
  uVar10 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar10 = 0;
  }
  uVar15 = 0;
  do {
    if (uVar15 == uVar10) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_90);
      return extraout_EAX;
    }
    Mat::channel(&local_78,top_blob,(int)uVar15);
    local_118 = local_78.data;
    Mat::~Mat(&local_78);
    for (uVar11 = 0; uVar11 != uVar9; uVar11 = uVar11 + 1) {
      for (uVar21 = 0; uVar21 != uVar14; uVar21 = uVar21 + 1) {
        local_148 = ZEXT816(0);
        if (!bVar23) {
          local_148 = ZEXT416(*(uint *)((long)bias_data->data + uVar15 * 4));
        }
        pvVar20 = (void *)((long)weight_data->data + (long)iVar8 * 4);
        for (iVar6 = 0; iVar6 != iVar7; iVar6 = iVar6 + 1) {
          Mat::channel(&local_78,bottom_blob,iVar6);
          for (uVar12 = 0; uVar22 != uVar12; uVar12 = uVar12 + 1) {
            local_148._0_4_ =
                 (float)local_148._0_4_ +
                 *(float *)((long)pvVar20 + uVar12 * 4) *
                 *(float *)((long)local_78.data +
                           (long)local_90._M_impl.super__Vector_impl_data._M_start[uVar12] * 4 +
                           uVar21 * (long)stride_w * 4 +
                           (long)local_78.w * uVar11 * (long)stride_h * local_78.elemsize);
          }
          Mat::~Mat(&local_78);
          pvVar20 = (void *)((long)pvVar20 + (long)(int)uVar5 * 4);
        }
        if (activation_type - 1U < 6) {
          iVar7 = (*(code *)(&DAT_002d82b4 +
                            *(int *)(&DAT_002d82b4 + (ulong)(activation_type - 1U) * 4)))();
          return iVar7;
        }
        *(undefined4 *)((long)local_118 + uVar21 * 4) = local_148._0_4_;
      }
      local_118 = (void *)((long)local_118 + (long)(int)uVar2 * 4);
    }
    uVar15 = uVar15 + 1;
    iVar8 = iVar8 + kernel_h * iVar1 * kernel_w;
  } while( true );
}

Assistant:

static int convolution(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int bias_term = bias_data.empty() ? 0 : 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * inch * p;

                for (int q = 0; q < inch; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[space_ofs[k]]; // 20.72
                        float wt = kptr[k];
                        sum += val * wt; // 41.45
                    }

                    kptr += maxk;
                }

                outptr[j] = activation_ss(sum, activation_type, activation_params);
            }

            outptr += outw;
        }
    }

    return 0;
}